

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.h
# Opt level: O0

uint __kmp_wait<unsigned_int>(uint *spinner,uint checker,_func_kmp_uint32_uint_uint *pred,void *obj)

{
  uint uVar1;
  int iVar2;
  uint *in_RCX;
  code *in_RDX;
  undefined4 in_ESI;
  uint *in_RDI;
  int sync_iters;
  uint r;
  _func_kmp_uint32_uint_uint *f;
  kmp_uint32 spins;
  uint check;
  uint *spin;
  int local_50;
  int local_48;
  kmp_uint32 local_38;
  uint *local_28;
  
  local_48 = 0;
  local_28 = in_RCX;
  if ((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) && (in_RCX == (uint *)0x0)) {
    local_28 = in_RDI;
  }
  local_38 = __kmp_yield_init;
  do {
    while( true ) {
      uVar1 = *in_RDI;
      iVar2 = (*in_RDX)(uVar1,in_ESI);
      if (iVar2 != 0) {
        if ((__kmp_itt_prepare_delay <= local_48) &&
           (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0)) {
          (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(local_28);
        }
        return uVar1;
      }
      if ((((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
           (local_48 < __kmp_itt_prepare_delay)) &&
          (local_48 = local_48 + 1, __kmp_itt_prepare_delay <= local_48)) &&
         (__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0)) {
        (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(local_28);
      }
      __kmp_x86_pause();
      if ((__kmp_use_yield == 1) || (__kmp_use_yield == 2)) break;
LAB_001917ac:
      if ((__kmp_use_yield == 1) && (local_38 = local_38 - 2, local_38 == 0)) {
        __kmp_yield();
        local_38 = __kmp_yield_next;
      }
    }
    if (__kmp_avail_proc == 0) {
      local_50 = __kmp_xproc;
    }
    else {
      local_50 = __kmp_avail_proc;
    }
    if (__kmp_nth <= local_50) goto LAB_001917ac;
    __kmp_yield();
  } while( true );
}

Assistant:

static UT __kmp_wait(volatile UT *spinner, UT checker,
                     kmp_uint32 (*pred)(UT, UT) USE_ITT_BUILD_ARG(void *obj)) {
  // note: we may not belong to a team at this point
  volatile UT *spin = spinner;
  UT check = checker;
  kmp_uint32 spins;
  kmp_uint32 (*f)(UT, UT) = pred;
  UT r;

  KMP_FSYNC_SPIN_INIT(obj, CCAST(UT *, spin));
  KMP_INIT_YIELD(spins);
  // main wait spin loop
  while (!f(r = *spin, check)) {
    KMP_FSYNC_SPIN_PREPARE(obj);
    /* GEH - remove this since it was accidentally introduced when kmp_wait was
       split.
       It causes problems with infinite recursion because of exit lock */
    /* if ( TCR_4(__kmp_global.g.g_done) && __kmp_global.g.g_abort)
        __kmp_abort_thread(); */
    // If oversubscribed, or have waited a bit then yield.
    KMP_YIELD_OVERSUB_ELSE_SPIN(spins);
  }
  KMP_FSYNC_SPIN_ACQUIRED(obj);
  return r;
}